

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack17_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1ffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x11;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 3) << 0xf | *puVar1;
  out[2] = *puVar2 >> 2 & 0x1ffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x13;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xf) << 0xd | *puVar1;
  out[4] = *puVar2 >> 4 & 0x1ffff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x15;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0x3f) << 0xb | *puVar1;
  out[6] = *puVar2 >> 6 & 0x1ffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x17;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0xff) << 9 | *puVar1;
  out[8] = *puVar2 >> 8 & 0x1ffff;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x19;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0x3ff) << 7 | *puVar1;
  out[10] = *puVar2 >> 10 & 0x1ffff;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1b;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0xfff) << 5 | *puVar1;
  out[0xc] = *puVar2 >> 0xc & 0x1ffff;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x1d;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0x3fff) << 3 | *puVar1;
  out[0xe] = *puVar2 >> 0xe & 0x1ffff;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[8] & 0xffff) << 1 | *puVar1;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack17_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 2)) << (17 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 17);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 4)) << (17 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 17);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 6)) << (17 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 17);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 8)) << (17 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 17);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 10)) << (17 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 17);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 12)) << (17 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 17);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 14)) << (17 - 14);
  out++;
  *out = ((*in) >> 14) % (1U << 17);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 16)) << (17 - 16);
  out++;

  return in + 1;
}